

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_message.cpp
# Opt level: O1

void strings_equal<wchar_t>
               (string *n_s,string *n_p,int n,string *iexpected,locale *l,string *domain)

{
  anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
  *paVar1;
  pointer pcVar2;
  int iVar3;
  ostream *poVar4;
  basic_ostream<wchar_t,_std::char_traits<wchar_t>_> *pbVar5;
  runtime_error *prVar6;
  size_t sVar7;
  void *__buf;
  void *__buf_00;
  bool bVar8;
  locale tmp_locale;
  string_type expected;
  string_type tmp;
  string_type p;
  string_type s;
  basic_ostringstream<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> ss;
  locale local_2f0;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> local_2e8;
  undefined1 local_2c8 [32];
  _Alloc_hider local_2a8;
  size_type local_2a0;
  anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
  local_298;
  _Alloc_hider local_288;
  size_type local_280;
  anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
  local_278;
  _Alloc_hider local_268;
  size_type local_260;
  anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
  local_258;
  string_type local_248;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> local_228;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> local_208;
  locale local_1e8;
  undefined1 local_1e0 [32];
  _Alloc_hider local_1c0;
  size_type local_1b8;
  anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
  local_1b0;
  _Alloc_hider local_1a0;
  size_type local_198;
  anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
  local_190;
  _Alloc_hider local_180;
  size_type local_178;
  anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
  local_170 [16];
  locale local_68;
  locale local_60;
  locale local_58;
  locale local_50;
  locale local_48;
  locale local_40;
  locale local_38;
  
  std::locale::locale(&local_1e8,l);
  to_correct_string<wchar_t>(&local_2e8,iexpected,&local_1e8);
  std::locale::~locale(&local_1e8);
  std::__cxx11::string::string((string *)local_1e0,(n_s->_M_dataplus)._M_p,(allocator *)local_2c8);
  to<wchar_t>(&local_208,(string *)local_1e0);
  if ((undefined1 *)local_1e0._0_8_ != local_1e0 + 0x10) {
    operator_delete((void *)local_1e0._0_8_);
  }
  std::__cxx11::string::string((string *)local_1e0,(n_p->_M_dataplus)._M_p,(allocator *)local_2c8);
  to<wchar_t>(&local_228,(string *)local_1e0);
  if ((undefined1 *)local_1e0._0_8_ != local_1e0 + 0x10) {
    operator_delete((void *)local_1e0._0_8_);
  }
  iVar3 = std::__cxx11::string::compare((char *)domain);
  if (iVar3 != 0) goto LAB_001141c3;
  test_counter = test_counter + 1;
  booster::locale::basic_message<wchar_t>::basic_message
            ((basic_message<wchar_t> *)local_1e0,&local_208,&local_228,n);
  booster::locale::basic_message<wchar_t>::str_abi_cxx11_
            ((string_type *)local_2c8,(basic_message<wchar_t> *)local_1e0,l,0);
  if (local_2c8._8_8_ == local_2e8._M_string_length) {
    if ((pointer)local_2c8._8_8_ == (pointer)0x0) {
      bVar8 = true;
    }
    else {
      iVar3 = wmemcmp((wchar_t *)local_2c8._0_8_,local_2e8._M_dataplus._M_p,local_2c8._8_8_);
      bVar8 = iVar3 == 0;
    }
  }
  else {
    bVar8 = false;
  }
  if ((undefined1 *)local_2c8._0_8_ != local_2c8 + 0x10) {
    operator_delete((void *)local_2c8._0_8_);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_180._M_p != local_170) {
    operator_delete(local_180._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_1a0._M_p != &local_190) {
    operator_delete(local_1a0._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_1c0._M_p != &local_1b0) {
    operator_delete(local_1c0._M_p);
  }
  if (!bVar8) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x7d);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar4," bl::translate(s,p,n).str(l)==expected",0x26);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
    std::ostream::put((char)poVar4);
    std::ostream::flush();
    iVar3 = error_counter + 1;
    bVar8 = 0x14 < error_counter;
    error_counter = iVar3;
    if (bVar8) {
      prVar6 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_1e0._0_8_ = local_1e0 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1e0,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar6,(string *)local_1e0);
      __cxa_throw(prVar6,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  local_1e0._0_4_ = n;
  local_1e0._8_8_ = local_208._M_dataplus._M_p;
  local_1e0._16_8_ = 0;
  local_1e0._24_8_ = local_228._M_dataplus._M_p;
  local_1b8 = 0;
  local_1b0._M_local_buf[0] = L'\0';
  local_198 = 0;
  local_190._M_local_buf[0] = L'\0';
  local_178 = 0;
  local_170[0]._M_local_buf[0] = L'\0';
  local_1c0._M_p = (pointer)&local_1b0;
  local_1a0._M_p = (pointer)&local_190;
  local_180._M_p = (pointer)local_170;
  booster::locale::basic_message<wchar_t>::str_abi_cxx11_
            ((string_type *)local_2c8,(basic_message<wchar_t> *)local_1e0,l,0);
  if (local_2c8._8_8_ == local_2e8._M_string_length) {
    if ((pointer)local_2c8._8_8_ == (pointer)0x0) {
      bVar8 = true;
    }
    else {
      iVar3 = wmemcmp((wchar_t *)local_2c8._0_8_,local_2e8._M_dataplus._M_p,local_2c8._8_8_);
      bVar8 = iVar3 == 0;
    }
  }
  else {
    bVar8 = false;
  }
  if ((undefined1 *)local_2c8._0_8_ != local_2c8 + 0x10) {
    operator_delete((void *)local_2c8._0_8_);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_180._M_p != local_170) {
    operator_delete(local_180._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_1a0._M_p != &local_190) {
    operator_delete(local_1a0._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_1c0._M_p != &local_1b0) {
    operator_delete(local_1c0._M_p);
  }
  if (!bVar8) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x7f);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar4," bl::translate(s_c_str,p_c_str,n).str(l)==expected",0x32);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
    std::ostream::put((char)poVar4);
    std::ostream::flush();
    iVar3 = error_counter + 1;
    bVar8 = 0x14 < error_counter;
    error_counter = iVar3;
    if (bVar8) {
      prVar6 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_1e0._0_8_ = local_1e0 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1e0,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar6,(string *)local_1e0);
      __cxa_throw(prVar6,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::locale::locale(&local_2f0);
  std::locale::global(&local_38);
  std::locale::~locale(&local_38);
  booster::locale::basic_message<wchar_t>::basic_message
            ((basic_message<wchar_t> *)local_1e0,&local_208,&local_228,n);
  booster::locale::basic_message<wchar_t>::str_abi_cxx11_
            (&local_248,(basic_message<wchar_t> *)local_1e0);
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_180._M_p != local_170) {
    operator_delete(local_180._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_1a0._M_p != &local_190) {
    operator_delete(local_1a0._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_1c0._M_p != &local_1b0) {
    operator_delete(local_1c0._M_p);
  }
  test_counter = test_counter + 1;
  if (local_248._M_string_length == local_2e8._M_string_length) {
    if ((pointer)local_248._M_string_length != (pointer)0x0) {
      iVar3 = wmemcmp(local_248._M_dataplus._M_p,local_2e8._M_dataplus._M_p,
                      local_248._M_string_length);
      if (iVar3 != 0) goto LAB_00113e0d;
    }
  }
  else {
LAB_00113e0d:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x83);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," tmp==expected",0xe);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
    std::ostream::put((char)poVar4);
    std::ostream::flush();
    iVar3 = error_counter + 1;
    bVar8 = 0x14 < error_counter;
    error_counter = iVar3;
    if (bVar8) {
      prVar6 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_1e0._0_8_ = local_1e0 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1e0,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar6,(string *)local_1e0);
      __cxa_throw(prVar6,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  booster::locale::basic_message<wchar_t>::basic_message
            ((basic_message<wchar_t> *)local_1e0,&local_208,&local_228,n);
  booster::locale::basic_message<wchar_t>::str_abi_cxx11_
            ((string_type *)local_2c8,(basic_message<wchar_t> *)local_1e0);
  std::__cxx11::wstring::operator=(&local_248,local_2c8);
  if ((undefined1 *)local_2c8._0_8_ != local_2c8 + 0x10) {
    operator_delete((void *)local_2c8._0_8_);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_180._M_p != local_170) {
    operator_delete(local_180._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_1a0._M_p != &local_190) {
    operator_delete(local_1a0._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_1c0._M_p != &local_1b0) {
    operator_delete(local_1c0._M_p);
  }
  test_counter = test_counter + 1;
  if (local_248._M_string_length == local_2e8._M_string_length) {
    if ((pointer)local_248._M_string_length != (pointer)0x0) {
      iVar3 = wmemcmp(local_248._M_dataplus._M_p,local_2e8._M_dataplus._M_p,
                      local_248._M_string_length);
      if (iVar3 != 0) goto LAB_00113f55;
    }
  }
  else {
LAB_00113f55:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x85);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," tmp==expected",0xe);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
    std::ostream::put((char)poVar4);
    std::ostream::flush();
    iVar3 = error_counter + 1;
    bVar8 = 0x14 < error_counter;
    error_counter = iVar3;
    if (bVar8) {
      prVar6 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_1e0._0_8_ = local_1e0 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1e0,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar6,(string *)local_1e0);
      __cxa_throw(prVar6,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::locale::global(&local_40);
  std::locale::~locale(&local_40);
  std::__cxx11::wostringstream::wostringstream((wostringstream *)local_1e0);
  std::wios::imbue(&local_48);
  std::locale::~locale(&local_48);
  sVar7 = (size_t)(uint)n;
  booster::locale::basic_message<wchar_t>::basic_message
            ((basic_message<wchar_t> *)local_2c8,&local_208,&local_228,n);
  booster::locale::basic_message<wchar_t>::write
            ((basic_message<wchar_t> *)local_2c8,(int)local_1e0,__buf,sVar7);
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_268._M_p != &local_258) {
    operator_delete(local_268._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_288._M_p != &local_278) {
    operator_delete(local_288._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_2a8._M_p != &local_298) {
    operator_delete(local_2a8._M_p);
  }
  test_counter = test_counter + 1;
  std::__cxx11::wstringbuf::str();
  if (local_2c8._8_8_ == local_2e8._M_string_length) {
    if ((pointer)local_2c8._8_8_ == (pointer)0x0) {
      bVar8 = true;
    }
    else {
      iVar3 = wmemcmp((wchar_t *)local_2c8._0_8_,local_2e8._M_dataplus._M_p,local_2c8._8_8_);
      bVar8 = iVar3 == 0;
    }
  }
  else {
    bVar8 = false;
  }
  if ((undefined1 *)local_2c8._0_8_ != local_2c8 + 0x10) {
    operator_delete((void *)local_2c8._0_8_);
  }
  if (!bVar8) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x8b);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," ss.str()==expected",0x13);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
    std::ostream::put((char)poVar4);
    std::ostream::flush();
    iVar3 = error_counter + 1;
    bVar8 = 0x14 < error_counter;
    error_counter = iVar3;
    if (bVar8) {
      prVar6 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_2c8._0_8_ = local_2c8 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_2c8,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar6,(string *)local_2c8);
      __cxa_throw(prVar6,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::wostringstream::~wostringstream((wostringstream *)local_1e0);
  std::ios_base::~ios_base((ios_base *)local_170);
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_248._M_dataplus._M_p != &local_248.field_2) {
    operator_delete(local_248._M_dataplus._M_p);
  }
  std::locale::~locale(&local_2f0);
LAB_001141c3:
  test_counter = test_counter + 1;
  booster::locale::basic_message<wchar_t>::basic_message
            ((basic_message<wchar_t> *)local_1e0,&local_208,&local_228,n);
  booster::locale::basic_message<wchar_t>::str
            ((string_type *)local_2c8,(basic_message<wchar_t> *)local_1e0,l,domain);
  if (local_2c8._8_8_ == local_2e8._M_string_length) {
    if ((pointer)local_2c8._8_8_ == (pointer)0x0) {
      bVar8 = true;
    }
    else {
      iVar3 = wmemcmp((wchar_t *)local_2c8._0_8_,local_2e8._M_dataplus._M_p,local_2c8._8_8_);
      bVar8 = iVar3 == 0;
    }
  }
  else {
    bVar8 = false;
  }
  if ((undefined1 *)local_2c8._0_8_ != local_2c8 + 0x10) {
    operator_delete((void *)local_2c8._0_8_);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_180._M_p != local_170) {
    operator_delete(local_180._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_1a0._M_p != &local_190) {
    operator_delete(local_1a0._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_1c0._M_p != &local_1b0) {
    operator_delete(local_1c0._M_p);
  }
  if (!bVar8) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x8d);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar4," bl::translate(s,p,n).str(l,domain)==expected",0x2d);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
    std::ostream::put((char)poVar4);
    std::ostream::flush();
    iVar3 = error_counter + 1;
    bVar8 = 0x14 < error_counter;
    error_counter = iVar3;
    if (bVar8) {
      prVar6 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_1e0._0_8_ = local_1e0 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1e0,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar6,(string *)local_1e0);
      __cxa_throw(prVar6,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::locale::locale(&local_2f0);
  std::locale::global(&local_50);
  std::locale::~locale(&local_50);
  test_counter = test_counter + 1;
  booster::locale::basic_message<wchar_t>::basic_message
            ((basic_message<wchar_t> *)local_1e0,&local_208,&local_228,n);
  booster::locale::basic_message<wchar_t>::str
            ((string_type *)local_2c8,(basic_message<wchar_t> *)local_1e0,domain);
  if (local_2c8._8_8_ == local_2e8._M_string_length) {
    if ((pointer)local_2c8._8_8_ == (pointer)0x0) {
      bVar8 = true;
    }
    else {
      iVar3 = wmemcmp((wchar_t *)local_2c8._0_8_,local_2e8._M_dataplus._M_p,local_2c8._8_8_);
      bVar8 = iVar3 == 0;
    }
  }
  else {
    bVar8 = false;
  }
  if ((undefined1 *)local_2c8._0_8_ != local_2c8 + 0x10) {
    operator_delete((void *)local_2c8._0_8_);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_180._M_p != local_170) {
    operator_delete(local_180._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_1a0._M_p != &local_190) {
    operator_delete(local_1a0._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_1c0._M_p != &local_1b0) {
    operator_delete(local_1c0._M_p);
  }
  if (!bVar8) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x90);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar4," bl::translate(s,p,n).str(domain)==expected",0x2b);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
    std::ostream::put((char)poVar4);
    std::ostream::flush();
    iVar3 = error_counter + 1;
    bVar8 = 0x14 < error_counter;
    error_counter = iVar3;
    if (bVar8) {
      prVar6 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_1e0._0_8_ = local_1e0 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1e0,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar6,(string *)local_1e0);
      __cxa_throw(prVar6,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::locale::global(&local_58);
  std::locale::~locale(&local_58);
  std::__cxx11::wostringstream::wostringstream((wostringstream *)local_1e0);
  std::wios::imbue(&local_60);
  std::locale::~locale(&local_60);
  paVar1 = &local_248.field_2;
  pcVar2 = (domain->_M_dataplus)._M_p;
  local_248._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_248,pcVar2,pcVar2 + domain->_M_string_length);
  pbVar5 = booster::locale::as::details::operator<<
                     ((basic_ostream<wchar_t,_std::char_traits<wchar_t>_> *)local_1e0,
                      (set_domain *)&local_248);
  sVar7 = (size_t)(uint)n;
  booster::locale::basic_message<wchar_t>::basic_message
            ((basic_message<wchar_t> *)local_2c8,&local_208,&local_228,n);
  booster::locale::basic_message<wchar_t>::write
            ((basic_message<wchar_t> *)local_2c8,(int)pbVar5,__buf_00,sVar7);
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_268._M_p != &local_258) {
    operator_delete(local_268._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_288._M_p != &local_278) {
    operator_delete(local_288._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_2a8._M_p != &local_298) {
    operator_delete(local_2a8._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_248._M_dataplus._M_p != paVar1) {
    operator_delete(local_248._M_dataplus._M_p);
  }
  test_counter = test_counter + 1;
  std::__cxx11::wstringbuf::str();
  if (local_2c8._8_8_ == local_2e8._M_string_length) {
    if ((pointer)local_2c8._8_8_ == (pointer)0x0) {
      bVar8 = true;
    }
    else {
      iVar3 = wmemcmp((wchar_t *)local_2c8._0_8_,local_2e8._M_dataplus._M_p,local_2c8._8_8_);
      bVar8 = iVar3 == 0;
    }
  }
  else {
    bVar8 = false;
  }
  if ((undefined1 *)local_2c8._0_8_ != local_2c8 + 0x10) {
    operator_delete((void *)local_2c8._0_8_);
  }
  if (!bVar8) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x96);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," ss.str()==expected",0x13);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
    std::ostream::put((char)poVar4);
    std::ostream::flush();
    iVar3 = error_counter + 1;
    bVar8 = 0x14 < error_counter;
    error_counter = iVar3;
    if (bVar8) {
      prVar6 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_2c8._0_8_ = local_2c8 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_2c8,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar6,(string *)local_2c8);
      __cxa_throw(prVar6,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::wostringstream::~wostringstream((wostringstream *)local_1e0);
  std::ios_base::~ios_base((ios_base *)local_170);
  std::__cxx11::wostringstream::wostringstream((wostringstream *)local_1e0);
  std::wios::imbue(&local_68);
  std::locale::~locale(&local_68);
  pcVar2 = (domain->_M_dataplus)._M_p;
  local_248._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_248,pcVar2,pcVar2 + domain->_M_string_length);
  pbVar5 = booster::locale::as::details::operator<<
                     ((basic_ostream<wchar_t,_std::char_traits<wchar_t>_> *)local_1e0,
                      (set_domain *)&local_248);
  local_2c8._0_4_ = n;
  local_2c8._8_8_ = local_208._M_dataplus._M_p;
  local_2c8._16_8_ = 0;
  local_2c8._24_8_ = local_228._M_dataplus._M_p;
  local_2a0 = 0;
  local_298._M_local_buf[0] = L'\0';
  local_280 = 0;
  local_278._M_local_buf[0] = L'\0';
  local_260 = 0;
  local_258._M_local_buf[0] = L'\0';
  local_2a8._M_p = (pointer)&local_298;
  local_288._M_p = (pointer)&local_278;
  local_268._M_p = (pointer)&local_258;
  booster::locale::basic_message<wchar_t>::write
            ((basic_message<wchar_t> *)local_2c8,(int)pbVar5,local_228._M_dataplus._M_p,0);
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_268._M_p != &local_258) {
    operator_delete(local_268._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_288._M_p != &local_278) {
    operator_delete(local_288._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_2a8._M_p != &local_298) {
    operator_delete(local_2a8._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_248._M_dataplus._M_p != paVar1) {
    operator_delete(local_248._M_dataplus._M_p);
  }
  test_counter = test_counter + 1;
  std::__cxx11::wstringbuf::str();
  if (local_2c8._8_8_ == local_2e8._M_string_length) {
    if ((pointer)local_2c8._8_8_ == (pointer)0x0) {
      bVar8 = true;
    }
    else {
      iVar3 = wmemcmp((wchar_t *)local_2c8._0_8_,local_2e8._M_dataplus._M_p,local_2c8._8_8_);
      bVar8 = iVar3 == 0;
    }
  }
  else {
    bVar8 = false;
  }
  if ((undefined1 *)local_2c8._0_8_ != local_2c8 + 0x10) {
    operator_delete((void *)local_2c8._0_8_);
  }
  if (!bVar8) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x9c);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," ss.str()==expected",0x13);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
    std::ostream::put((char)poVar4);
    std::ostream::flush();
    iVar3 = error_counter + 1;
    bVar8 = 0x14 < error_counter;
    error_counter = iVar3;
    if (bVar8) {
      prVar6 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_2c8._0_8_ = local_2c8 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_2c8,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar6,(string *)local_2c8);
      __cxa_throw(prVar6,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::wostringstream::~wostringstream((wostringstream *)local_1e0);
  std::ios_base::~ios_base((ios_base *)local_170);
  std::locale::~locale(&local_2f0);
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_228._M_dataplus._M_p != &local_228.field_2) {
    operator_delete(local_228._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_208._M_dataplus._M_p != &local_208.field_2) {
    operator_delete(local_208._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_2e8._M_dataplus._M_p != &local_2e8.field_2) {
    operator_delete(local_2e8._M_dataplus._M_p);
  }
  return;
}

Assistant:

void strings_equal(std::string n_s,std::string n_p,int n,std::string iexpected,std::locale const &l,std::string domain)
{
    typedef std::basic_string<Char> string_type;
    string_type expected=to_correct_string<Char>(iexpected,l);
    string_type s = to<Char>(n_s.c_str());
    string_type p = to<Char>(n_p.c_str());
    if(domain=="default") {
        TEST(bl::translate(s,p,n).str(l)==expected);
        Char const *s_c_str=s.c_str(), *p_c_str=p.c_str(); // workaround gcc-3.4 bug
        TEST(bl::translate(s_c_str,p_c_str,n).str(l)==expected);
        std::locale tmp_locale=std::locale();
        std::locale::global(l);
        string_type tmp=bl::translate(s,p,n);
        TEST(tmp==expected);
        tmp=bl::translate(s,p,n).str();
        TEST(tmp==expected);
        std::locale::global(tmp_locale);

        std::basic_ostringstream<Char> ss;
        ss.imbue(l);
        ss << bl::translate(s,p,n);
        TEST(ss.str()==expected);
    }
    TEST(bl::translate(s,p,n).str(l,domain)==expected);
    std::locale tmp_locale=std::locale();
    std::locale::global(l);
    TEST(bl::translate(s,p,n).str(domain)==expected);
    std::locale::global(tmp_locale);
    {
        std::basic_ostringstream<Char> ss;
        ss.imbue(l);
        ss << bl::as::domain(domain) << bl::translate(s,p,n);
        TEST(ss.str()==expected);
    }
    {
        std::basic_ostringstream<Char> ss;
        ss.imbue(l);
        ss << bl::as::domain(domain) << bl::translate(s.c_str(),p.c_str(),n);
        TEST(ss.str()==expected);
    }
}